

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_dual.cpp
# Opt level: O0

void __thiscall cppcms::sessions::session_dual::clear(session_dual *this,session_interface *session)

{
  ulong uVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined8 in_RSI;
  string cookie;
  string local_30 [8];
  session_interface *in_stack_ffffffffffffffd8;
  
  session_interface::get_session_cookie_abi_cxx11_(in_stack_ffffffffffffffd8);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    if (*pcVar2 == 'C') {
      peVar3 = std::
               __shared_ptr_access<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x43da95);
      (*(peVar3->super_session_api)._vptr_session_api[2])(peVar3,in_RSI);
      goto LAB_0043dae7;
    }
  }
  peVar4 = std::
           __shared_ptr_access<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x43dad2);
  (*(peVar4->super_session_api)._vptr_session_api[2])(peVar4,in_RSI);
LAB_0043dae7:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void session_dual::clear(session_interface &session)
{
	std::string cookie = session.get_session_cookie();
	if(!cookie.empty() && cookie[0]=='C') {
		client_->clear(session);
	}
	else {
		server_->clear(session);
	}
}